

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PClass::BuildFlatPointers(PClass *this)

{
  size_t *__src;
  size_t *__src_00;
  long lVar1;
  size_t *__dest;
  long lVar2;
  size_t __n;
  long lVar3;
  
  if (this->FlatPointers == (size_t *)0x0) {
    if (this->ParentClass == (PClass *)0x0) {
      __dest = &TheEnd;
      if (this->Pointers != (size_t *)0x0) {
        __dest = this->Pointers;
      }
    }
    else {
      BuildFlatPointers(this->ParentClass);
      __src = this->Pointers;
      if (__src == (size_t *)0x0) {
        __dest = this->ParentClass->FlatPointers;
      }
      else {
        lVar3 = 0;
        do {
          lVar2 = lVar3;
          lVar3 = lVar2 + 1;
        } while (__src[lVar2] != 0xffffffffffffffff);
        __src_00 = this->ParentClass->FlatPointers;
        lVar3 = 1;
        __n = 0xfffffffffffffff8;
        do {
          lVar3 = lVar3 + -1;
          lVar1 = __n + 8;
          __n = __n + 8;
        } while (*(long *)((long)__src_00 + lVar1) != -1);
        __dest = (size_t *)operator_new__((ulong)(uint)((int)(lVar2 + 1) - (int)lVar3) << 3);
        if (lVar3 != 0) {
          memcpy(__dest,__src_00,__n);
        }
        memcpy((void *)((long)__dest + __n),__src,(ulong)((int)lVar2 + 1) << 3);
      }
    }
    this->FlatPointers = __dest;
    return;
  }
  return;
}

Assistant:

void PClass::BuildFlatPointers ()
{
	if (FlatPointers != NULL)
	{ // Already built: Do nothing.
		return;
	}
	else if (ParentClass == NULL)
	{ // No parent: FlatPointers is the same as Pointers.
		if (Pointers == NULL)
		{ // No pointers: Make FlatPointers a harmless non-NULL.
			FlatPointers = &TheEnd;
		}
		else
		{
			FlatPointers = Pointers;
		}
	}
	else
	{
		ParentClass->BuildFlatPointers ();
		if (Pointers == NULL)
		{ // No new pointers: Just use the same FlatPointers as the parent.
			FlatPointers = ParentClass->FlatPointers;
		}
		else
		{ // New pointers: Create a new FlatPointers array and add them.
			int numPointers, numSuperPointers;

			// Count pointers defined by this class.
			for (numPointers = 0; Pointers[numPointers] != ~(size_t)0; numPointers++)
			{ }
			// Count pointers defined by superclasses.
			for (numSuperPointers = 0; ParentClass->FlatPointers[numSuperPointers] != ~(size_t)0; numSuperPointers++)
			{ }

			// Concatenate them into a new array
			size_t *flat = new size_t[numPointers + numSuperPointers + 1];
			if (numSuperPointers > 0)
			{
				memcpy (flat, ParentClass->FlatPointers, sizeof(size_t)*numSuperPointers);
			}
			memcpy (flat + numSuperPointers, Pointers, sizeof(size_t)*(numPointers+1));
			FlatPointers = flat;
		}
	}
}